

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b)

{
  pointer __dest;
  long lVar1;
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)a->piece_size_ + (char)*(undefined8 *)(this + 8));
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  memcpy(__dest,*(void **)this,*(size_t *)(this + 8));
  lVar1 = *(long *)(this + 8);
  memcpy(__dest + lVar1,a->piece_data_,a->piece_size_);
  if (__dest + lVar1 + a->piece_size_ != __dest + __return_storage_ptr__->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x5c9);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b) {
  string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}